

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

double __thiscall HighsLpRelaxation::slackLower(HighsLpRelaxation *this,HighsInt row)

{
  const_reference pvVar1;
  int in_ESI;
  HighsDomain *in_RDI;
  HighsInt in_stack_0000001c;
  HighsCutPool *in_stack_00000020;
  double rowlower;
  undefined8 in_stack_ffffffffffffffb8;
  HighsInt row_00;
  HighsLpRelaxation *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  HighsInt row_01;
  double local_8;
  
  row_01 = (HighsInt)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  row_00 = (HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  pvVar1 = std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::
           operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *
                      )&in_RDI[0x19].objProp_.objectiveLower,(long)in_ESI);
  if (pvVar1->origin == kModel) {
    local_8 = rowLower(in_stack_ffffffffffffffc0,row_00);
    if ((local_8 == -INFINITY) && (!NAN(local_8))) {
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x6030d8);
      std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::operator[]
                ((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *)
                 &in_RDI[0x19].objProp_.objectiveLower,(long)in_ESI);
      local_8 = HighsDomain::getMinActivity(in_RDI,row_01);
    }
  }
  else if (pvVar1->origin == kCutPool) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x60302b)
    ;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x60304e)
    ;
    std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::operator[]
              ((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *)
               &in_RDI[0x19].objProp_.objectiveLower,(long)in_ESI);
    local_8 = HighsDomain::getMinCutActivity
                        ((HighsDomain *)rowlower,in_stack_00000020,in_stack_0000001c);
  }
  else {
    local_8 = -INFINITY;
  }
  return local_8;
}

Assistant:

double HighsLpRelaxation::slackLower(HighsInt row) const {
  switch (lprows[row].origin) {
    case LpRow::kCutPool:
      return mipsolver.mipdata_->domain.getMinCutActivity(
          mipsolver.mipdata_->cutpool, lprows[row].index);
    case LpRow::kModel:
      double rowlower = rowLower(row);
      if (rowlower != -kHighsInf) return rowlower;
      return mipsolver.mipdata_->domain.getMinActivity(lprows[row].index);
  };

  assert(false);
  return -kHighsInf;
}